

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall kj::str<char_const&>(String *__return_storage_ptr__,kj *this,char *params)

{
  char *value;
  FixedArray<char,_1UL> *params_00;
  _ local_19;
  kj *local_18;
  char *params_local;
  
  local_18 = this;
  params_local = (char *)__return_storage_ptr__;
  value = fwd<char_const&>((char *)this);
  local_19 = (_)toCharSequence<char_const&>(value);
  _::concat<kj::FixedArray<char,1ul>>(__return_storage_ptr__,&local_19,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}